

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

LittleEndianPODVisitor<unsigned_int> * __thiscall
Protocol::MQTT::V5::VisitorVariant::as<Protocol::MQTT::Common::LittleEndianPODVisitor<unsigned_int>>
          (VisitorVariant *this)

{
  VisitorVariant *this_local;
  
  switch(this->type) {
  case '\0':
    this_local = (VisitorVariant *)0x0;
    break;
  case '\x01':
    this_local = (VisitorVariant *)0x0;
    break;
  case '\x02':
    this_local = this;
    break;
  case '\x03':
    this_local = (VisitorVariant *)0x0;
    break;
  case '\x04':
    this_local = (VisitorVariant *)0x0;
    break;
  case '\x05':
    this_local = (VisitorVariant *)0x0;
    break;
  case '\x06':
    this_local = (VisitorVariant *)0x0;
    break;
  default:
    this_local = (VisitorVariant *)0x0;
  }
  return (LittleEndianPODVisitor<unsigned_int> *)this_local;
}

Assistant:

T * as()
                {
                    switch (type)
                    {
                    case 0: return PrivateRegistry::is_same<T, PODVisitor<uint8> >             ::Value ? reinterpret_cast<T*>(buffer) : 0;
                    case 1: return PrivateRegistry::is_same<T, LittleEndianPODVisitor<uint16> >::Value ? reinterpret_cast<T*>(buffer) : 0;
                    case 2: return PrivateRegistry::is_same<T, LittleEndianPODVisitor<uint32> >::Value ? reinterpret_cast<T*>(buffer) : 0;
                    case 3: return PrivateRegistry::is_same<T, MappedVBInt >                   ::Value ? reinterpret_cast<T*>(buffer) : 0;
                    case 4: return PrivateRegistry::is_same<T, DynamicBinDataView >            ::Value ? reinterpret_cast<T*>(buffer) : 0;
                    case 5: return PrivateRegistry::is_same<T, DynamicStringView >             ::Value ? reinterpret_cast<T*>(buffer) : 0;
                    case 6: return PrivateRegistry::is_same<T, DynamicStringPairView >         ::Value ? reinterpret_cast<T*>(buffer) : 0;
                    default: return 0;
                    }
                }